

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfs.c
# Opt level: O2

lws_plat_file_ops * lws_vfs_select_fops(lws_plat_file_ops *fops,char *vfs_path,char **vpath)

{
  char *__s2;
  lws_plat_file_ops *plVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  lws_plat_file_ops **pplVar5;
  char *pcVar6;
  
  *vpath = (char *)0x0;
  if (fops->next != (lws_plat_file_ops *)0x0) {
    for (pcVar6 = vfs_path; pcVar6 != (char *)0x0; pcVar6 = pcVar6 + 1) {
      pplVar5 = &fops->next;
      if (*pcVar6 == '/') {
        while (plVar1 = *pplVar5, plVar1 != (lws_plat_file_ops *)0x0) {
          for (lVar4 = 0x30;
              (lVar4 != 0x60 &&
              (__s2 = *(char **)((long)(plVar1->fi + -3) + lVar4), __s2 != (char *)0x0));
              lVar4 = lVar4 + 0x10) {
            uVar3 = (ulong)*(byte *)((long)plVar1->fi + lVar4 + -0x28);
            if ((vfs_path + uVar3 <= pcVar6) &&
               (iVar2 = strncmp(pcVar6 + (1 - uVar3),__s2,uVar3 - 1), iVar2 == 0)) {
              *vpath = pcVar6 + 1;
              return plVar1;
            }
          }
          pplVar5 = &plVar1->next;
        }
      }
      else if (*pcVar6 == '\0') {
        return fops;
      }
    }
  }
  return fops;
}

Assistant:

const struct lws_plat_file_ops *
lws_vfs_select_fops(const struct lws_plat_file_ops *fops, const char *vfs_path,
		    const char **vpath)
{
	const struct lws_plat_file_ops *pf;
	const char *p = vfs_path;
	int n;

	*vpath = NULL;

	/* no non-platform fops, just use that */

	if (!fops->next)
		return fops;

	/*
	 *  scan the vfs path looking for indications we are to be
	 * handled by a specific fops
	 */

	while (p && *p) {
		if (*p != '/') {
			p++;
			continue;
		}
		/* the first one is always platform fops, so skip */
		pf = fops->next;
		while (pf) {
			n = 0;
			while (n < (int)LWS_ARRAY_SIZE(pf->fi) && pf->fi[n].sig) {
				if (p >= vfs_path + pf->fi[n].len)
					if (!strncmp(p - (pf->fi[n].len - 1),
						     pf->fi[n].sig,
						     pf->fi[n].len - 1)) {
						*vpath = p + 1;
						return pf;
					}

				n++;
			}
			pf = pf->next;
		}
		p++;
	}

	return fops;
}